

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O1

void process_line(BinarySource *in,strbuf *out)

{
  _Bool _Var1;
  uchar uVar2;
  uchar uVar3;
  uint uVar4;
  undefined8 in_RAX;
  Value *pVVar5;
  strbuf *psVar6;
  ulong uVar7;
  char *decimal;
  mp_int *pmVar8;
  ssh2_mac *psVar9;
  prng *ppVar10;
  Pockle *v;
  size_t sVar11;
  size_t unaff_RBX;
  strbuf *psVar12;
  BinarySource *src;
  ptrlen pVar13;
  undefined5 uVar14;
  char cVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  
  uVar14 = (undefined5)in_RAX;
  cVar15 = (char)((ulong)in_RAX >> 0x28);
  uVar16 = (undefined1)((ulong)in_RAX >> 0x30);
  uVar17 = (undefined1)((ulong)in_RAX >> 0x38);
  pVar13 = get_word(in);
  psVar6 = (strbuf *)pVar13.len;
  _Var1 = ptrlen_eq_string(pVar13,"hello");
  if (_Var1) {
    BinarySink_put_fmt(out->binarysink_,"hello, world\n");
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"free");
  if (_Var1) {
    get_word(in);
    pVar13.ptr._5_1_ = cVar15;
    pVar13.ptr._0_5_ = uVar14;
    pVar13.ptr._6_1_ = uVar16;
    pVar13.ptr._7_1_ = uVar17;
    pVar13.len = unaff_RBX;
    pVVar5 = lookup_value(pVar13);
    del234(values,pVVar5);
    free_value(pVVar5);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"newstring");
  if (_Var1) {
    psVar6 = strbuf_new();
    src = in->binarysource_;
    if (src->len != src->pos) {
      do {
        uVar2 = BinarySource_get_byte(src);
        if (uVar2 == '%') {
          uVar3 = BinarySource_get_byte(in->binarysource_);
          if (uVar3 != '%') {
            BinarySource_get_byte(in->binarysource_);
            uVar7 = strtoul(&stack0xffffffffffffffcd,(char **)0x0,0x10);
            uVar2 = (uchar)uVar7;
          }
        }
        BinarySink_put_byte(psVar6->binarysink_,uVar2);
        src = in->binarysource_;
      } while (src->len != src->pos);
    }
    return_val_string(out,psVar6);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"getstring");
  if (_Var1) {
    psVar6 = get_val_string(in);
    if (psVar6->len != 0) {
      uVar7 = 0;
      do {
        uVar2 = psVar6->s[uVar7];
        if ((byte)(uVar2 - 0x21) < 0x5e && uVar2 != '%') {
          BinarySink_put_byte(out->binarysink_,uVar2);
        }
        else {
          BinarySink_put_fmt(out->binarysink_,"%%%02X");
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < psVar6->len);
    }
    BinarySink_put_byte(out->binarysink_,'\n');
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_literal");
  if (_Var1) {
    pVar13 = get_word(in);
    decimal = mkstr(pVar13);
    if ((*decimal == '\0') || ((byte)(decimal[1] | 0x20U) != 0x78)) {
      pmVar8 = mp_from_decimal(decimal);
    }
    else {
      pmVar8 = mp_from_hex(decimal + 2);
    }
    safefree(decimal);
    return_val_mpint(out,pmVar8);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_dump");
  if (_Var1) {
    handle_mp_dump(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"checkenum");
  if (_Var1) {
    handle_checkenum(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_new");
  if (_Var1) {
    handle_mp_new(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_clear");
  if (_Var1) {
    pmVar8 = get_val_mpint(in);
    mp_clear(pmVar8);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_from_bytes_le");
  if (_Var1) {
    handle_mp_from_bytes_le(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_from_bytes_be");
  if (_Var1) {
    handle_mp_from_bytes_be(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_from_integer");
  if (_Var1) {
    handle_mp_from_integer(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_from_decimal_pl");
  if (_Var1) {
    handle_mp_from_decimal_pl(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_from_decimal");
  if (_Var1) {
    handle_mp_from_decimal(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_from_hex_pl");
  if (_Var1) {
    handle_mp_from_hex_pl(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_from_hex");
  if (_Var1) {
    handle_mp_from_hex(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_copy");
  if (_Var1) {
    handle_mp_copy(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_power_2");
  if (_Var1) {
    handle_mp_power_2(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_get_byte");
  if (_Var1) {
    handle_mp_get_byte(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_get_bit");
  if (_Var1) {
    handle_mp_get_bit(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_set_bit");
  if (_Var1) {
    handle_mp_set_bit(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_max_bytes");
  if (_Var1) {
    handle_mp_max_bytes(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_max_bits");
  if (_Var1) {
    handle_mp_max_bits(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_get_nbits");
  if (_Var1) {
    handle_mp_get_nbits(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_get_decimal");
  if (_Var1) {
    handle_mp_get_decimal(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_get_hex");
  if (_Var1) {
    handle_mp_get_hex(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_get_hex_uppercase");
  if (_Var1) {
    handle_mp_get_hex_uppercase(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_cmp_hs");
  if (_Var1) {
    handle_mp_cmp_hs(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_cmp_eq");
  if (_Var1) {
    handle_mp_cmp_eq(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_hs_integer");
  if (_Var1) {
    handle_mp_hs_integer(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_eq_integer");
  if (_Var1) {
    handle_mp_eq_integer(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_min_into");
  if (_Var1) {
    handle_mp_min_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_max_into");
  if (_Var1) {
    handle_mp_max_into(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_min");
  if (_Var1) {
    handle_mp_min(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_max");
  if (_Var1) {
    handle_mp_max(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_copy_into");
  if (_Var1) {
    handle_mp_copy_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_select_into");
  if (_Var1) {
    handle_mp_select_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_add_into");
  if (_Var1) {
    handle_mp_add_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_sub_into");
  if (_Var1) {
    handle_mp_sub_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_mul_into");
  if (_Var1) {
    handle_mp_mul_into(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_add");
  if (_Var1) {
    handle_mp_add(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_sub");
  if (_Var1) {
    handle_mp_sub(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_mul");
  if (_Var1) {
    handle_mp_mul(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_and_into");
  if (_Var1) {
    handle_mp_and_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_or_into");
  if (_Var1) {
    handle_mp_or_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_xor_into");
  if (_Var1) {
    handle_mp_xor_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_bic_into");
  if (_Var1) {
    handle_mp_bic_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_copy_integer_into");
  if (_Var1) {
    handle_mp_copy_integer_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_add_integer_into");
  if (_Var1) {
    handle_mp_add_integer_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_sub_integer_into");
  if (_Var1) {
    handle_mp_sub_integer_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_mul_integer_into");
  if (_Var1) {
    handle_mp_mul_integer_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_cond_add_into");
  if (_Var1) {
    handle_mp_cond_add_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_cond_sub_into");
  if (_Var1) {
    handle_mp_cond_sub_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_cond_swap");
  if (_Var1) {
    handle_mp_cond_swap(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_cond_clear");
  if (_Var1) {
    handle_mp_cond_clear(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_divmod_into");
  if (_Var1) {
    handle_mp_divmod_into(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_div");
  if (_Var1) {
    handle_mp_div(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_mod");
  if (_Var1) {
    handle_mp_mod(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_nthroot");
  if (_Var1) {
    handle_mp_nthroot(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_reduce_mod_2to");
  if (_Var1) {
    handle_mp_reduce_mod_2to(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_invert_mod_2to");
  if (_Var1) {
    handle_mp_invert_mod_2to(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_invert");
  if (_Var1) {
    handle_mp_invert(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_gcd_into");
  if (_Var1) {
    handle_mp_gcd_into(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_gcd");
  if (_Var1) {
    handle_mp_gcd(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_coprime");
  if (_Var1) {
    handle_mp_coprime(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"modsqrt_new");
  if (_Var1) {
    handle_modsqrt_new(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_modsqrt");
  if (_Var1) {
    handle_mp_modsqrt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"monty_new");
  if (_Var1) {
    handle_monty_new(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"monty_modulus");
  if (_Var1) {
    handle_monty_modulus(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"monty_identity");
  if (_Var1) {
    handle_monty_identity(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"monty_import_into");
  if (_Var1) {
    handle_monty_import_into(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"monty_import");
  if (_Var1) {
    handle_monty_import(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"monty_export_into");
  if (_Var1) {
    handle_monty_export_into(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"monty_export");
  if (_Var1) {
    handle_monty_export(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"monty_mul_into");
  if (_Var1) {
    handle_monty_mul_into(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"monty_add");
  if (_Var1) {
    handle_monty_add(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"monty_sub");
  if (_Var1) {
    handle_monty_sub(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"monty_mul");
  if (_Var1) {
    handle_monty_mul(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"monty_pow");
  if (_Var1) {
    handle_monty_pow(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"monty_invert");
  if (_Var1) {
    handle_monty_invert(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"monty_modsqrt");
  if (_Var1) {
    handle_monty_modsqrt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_modpow");
  if (_Var1) {
    handle_mp_modpow(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_modmul");
  if (_Var1) {
    handle_mp_modmul(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_modadd");
  if (_Var1) {
    handle_mp_modadd(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_modsub");
  if (_Var1) {
    handle_mp_modsub(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_lshift_safe_into");
  if (_Var1) {
    handle_mp_lshift_safe_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_rshift_safe_into");
  if (_Var1) {
    handle_mp_rshift_safe_into(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_rshift_safe");
  if (_Var1) {
    handle_mp_rshift_safe(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_lshift_fixed_into");
  if (_Var1) {
    handle_mp_lshift_fixed_into(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"mp_rshift_fixed_into");
  if (_Var1) {
    handle_mp_rshift_fixed_into(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_rshift_fixed");
  if (_Var1) {
    handle_mp_rshift_fixed(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_random_bits");
  if (_Var1) {
    handle_mp_random_bits(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"mp_random_in_range");
  if (_Var1) {
    handle_mp_random_in_range(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_curve");
  if (_Var1) {
    handle_ecc_weierstrass_curve(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_point_new_identity");
  if (_Var1) {
    handle_ecc_weierstrass_point_new_identity(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_point_new");
  if (_Var1) {
    handle_ecc_weierstrass_point_new(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_point_new_from_x");
  if (_Var1) {
    handle_ecc_weierstrass_point_new_from_x(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_point_copy");
  if (_Var1) {
    handle_ecc_weierstrass_point_copy(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_point_valid");
  if (_Var1) {
    handle_ecc_weierstrass_point_valid(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_add_general");
  if (_Var1) {
    handle_ecc_weierstrass_add_general(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_add");
  if (_Var1) {
    handle_ecc_weierstrass_add(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_double");
  if (_Var1) {
    handle_ecc_weierstrass_double(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_multiply");
  if (_Var1) {
    handle_ecc_weierstrass_multiply(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_is_identity");
  if (_Var1) {
    handle_ecc_weierstrass_is_identity(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ecc_weierstrass_get_affine");
  if (_Var1) {
    handle_ecc_weierstrass_get_affine(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_montgomery_curve");
  if (_Var1) {
    handle_ecc_montgomery_curve(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_montgomery_point_new");
  if (_Var1) {
    handle_ecc_montgomery_point_new(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_montgomery_point_copy");
  if (_Var1) {
    handle_ecc_montgomery_point_copy(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_montgomery_diff_add");
  if (_Var1) {
    handle_ecc_montgomery_diff_add(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_montgomery_double");
  if (_Var1) {
    handle_ecc_montgomery_double(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_montgomery_multiply");
  if (_Var1) {
    handle_ecc_montgomery_multiply(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ecc_montgomery_get_affine");
  if (_Var1) {
    handle_ecc_montgomery_get_affine(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_montgomery_is_identity");
  if (_Var1) {
    handle_ecc_montgomery_is_identity(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_edwards_curve");
  if (_Var1) {
    handle_ecc_edwards_curve(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_edwards_point_new");
  if (_Var1) {
    handle_ecc_edwards_point_new(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_edwards_point_new_from_y");
  if (_Var1) {
    handle_ecc_edwards_point_new_from_y(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_edwards_point_copy");
  if (_Var1) {
    handle_ecc_edwards_point_copy(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_edwards_add");
  if (_Var1) {
    handle_ecc_edwards_add(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_edwards_multiply");
  if (_Var1) {
    handle_ecc_edwards_multiply(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecc_edwards_eq");
  if (_Var1) {
    handle_ecc_edwards_eq(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ecc_edwards_get_affine");
  if (_Var1) {
    handle_ecc_edwards_get_affine(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_hash_new");
  if (_Var1) {
    handle_ssh_hash_new(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_hash_reset");
  if (_Var1) {
    pVVar5 = get_value_hash(in);
    (*((pVVar5->field_2).vu_hash)->vt->reset)((pVVar5->field_2).vu_hash);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_hash_copy");
  if (_Var1) {
    handle_ssh_hash_copy(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_hash_digest");
  if (_Var1) {
    handle_ssh_hash_digest(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_hash_final");
  if (_Var1) {
    handle_ssh_hash_final(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ssh_hash_update");
  if (_Var1) {
    handle_ssh_hash_update(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"blake2b_new_general");
  if (_Var1) {
    handle_blake2b_new_general(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh2_mac_new");
  if (_Var1) {
    handle_ssh2_mac_new(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ssh2_mac_setkey");
  if (_Var1) {
    handle_ssh2_mac_setkey(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh2_mac_start");
  if (_Var1) {
    psVar9 = get_val_mac(in);
    (*psVar9->vt->start)(psVar9);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ssh2_mac_update");
  if (_Var1) {
    handle_ssh2_mac_update(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh2_mac_genresult");
  if (_Var1) {
    handle_ssh2_mac_genresult(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh2_mac_text_name");
  if (_Var1) {
    handle_ssh2_mac_text_name(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_new_pub");
  if (_Var1) {
    handle_ssh_key_new_pub(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_new_priv");
  if (_Var1) {
    handle_ssh_key_new_priv(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_new_priv_openssh");
  if (_Var1) {
    handle_ssh_key_new_priv_openssh(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_invalid");
  if (_Var1) {
    handle_ssh_key_invalid(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_sign");
  if (_Var1) {
    handle_ssh_key_sign(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_verify");
  if (_Var1) {
    handle_ssh_key_verify(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_public_blob");
  if (_Var1) {
    handle_ssh_key_public_blob(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_private_blob");
  if (_Var1) {
    handle_ssh_key_private_blob(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_openssh_blob");
  if (_Var1) {
    handle_ssh_key_openssh_blob(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_cache_str");
  if (_Var1) {
    handle_ssh_key_cache_str(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_components");
  if (_Var1) {
    handle_ssh_key_components(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_public_bits");
  if (_Var1) {
    handle_ssh_key_public_bits(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_base_key");
  if (_Var1) {
    handle_ssh_key_base_key(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_ca_public_blob");
  if (_Var1) {
    handle_ssh_key_ca_public_blob(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_cert_id_string");
  if (_Var1) {
    handle_ssh_key_cert_id_string(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_key_check_cert");
  if (_Var1) {
    handle_ssh_key_check_cert(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"key_components_count");
  if (_Var1) {
    handle_key_components_count(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"key_components_nth_name");
  if (_Var1) {
    handle_key_components_nth_name(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"key_components_nth_str");
  if (_Var1) {
    handle_key_components_nth_str(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"key_components_nth_mp");
  if (_Var1) {
    handle_key_components_nth_mp(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_cipher_new");
  if (_Var1) {
    handle_ssh_cipher_new(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ssh_cipher_setiv");
  if (_Var1) {
    handle_ssh_cipher_setiv(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ssh_cipher_setkey");
  if (_Var1) {
    handle_ssh_cipher_setkey(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_cipher_encrypt");
  if (_Var1) {
    handle_ssh_cipher_encrypt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_cipher_decrypt");
  if (_Var1) {
    handle_ssh_cipher_decrypt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_cipher_encrypt_length");
  if (_Var1) {
    handle_ssh_cipher_encrypt_length(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_cipher_decrypt_length");
  if (_Var1) {
    handle_ssh_cipher_decrypt_length(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"dh_setup_group");
  if (_Var1) {
    handle_dh_setup_group(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"dh_setup_gex");
  if (_Var1) {
    handle_dh_setup_gex(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"dh_modulus_bit_size");
  if (_Var1) {
    handle_dh_modulus_bit_size(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"dh_create_e");
  if (_Var1) {
    handle_dh_create_e(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"dh_validate_f");
  if (_Var1) {
    handle_dh_validate_f(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"dh_find_K");
  if (_Var1) {
    handle_dh_find_K(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecdh_key_new");
  if (_Var1) {
    handle_ecdh_key_new(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ecdh_key_getpublic");
  if (_Var1) {
    handle_ecdh_key_getpublic(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecdh_key_getkey");
  if (_Var1) {
    handle_ecdh_key_getkey(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_ring_multiply");
  if (_Var1) {
    handle_ntru_ring_multiply(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_ring_invert");
  if (_Var1) {
    handle_ntru_ring_invert(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_mod3");
  if (_Var1) {
    handle_ntru_mod3(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_round3");
  if (_Var1) {
    handle_ntru_round3(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_bias");
  if (_Var1) {
    handle_ntru_bias(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_scale");
  if (_Var1) {
    handle_ntru_scale(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_encode_schedule");
  if (_Var1) {
    handle_ntru_encode_schedule(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_encode_schedule_length");
  if (_Var1) {
    handle_ntru_encode_schedule_length(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"ntru_encode");
  if (_Var1) {
    handle_ntru_encode(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_decode");
  if (_Var1) {
    handle_ntru_decode(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_gen_short");
  if (_Var1) {
    handle_ntru_gen_short(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_keygen");
  if (_Var1) {
    handle_ntru_keygen(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_pubkey");
  if (_Var1) {
    handle_ntru_pubkey(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_encrypt");
  if (_Var1) {
    handle_ntru_encrypt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ntru_decrypt");
  if (_Var1) {
    handle_ntru_decrypt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_rsakex_newkey");
  if (_Var1) {
    handle_ssh_rsakex_newkey(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_rsakex_klen");
  if (_Var1) {
    handle_ssh_rsakex_klen(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_rsakex_encrypt");
  if (_Var1) {
    handle_ssh_rsakex_encrypt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh_rsakex_decrypt");
  if (_Var1) {
    handle_ssh_rsakex_decrypt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"get_rsa_ssh1_priv_agent");
  if (_Var1) {
    handle_get_rsa_ssh1_priv_agent(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"rsa_new");
  if (_Var1) {
    handle_rsa_new((BinarySource *)out,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"get_rsa_ssh1_pub");
  if (_Var1) {
    handle_get_rsa_ssh1_pub(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"get_rsa_ssh1_priv");
  if (_Var1) {
    handle_get_rsa_ssh1_priv(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsa_ssh1_encrypt");
  if (_Var1) {
    handle_rsa_ssh1_encrypt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsa_ssh1_decrypt");
  if (_Var1) {
    handle_rsa_ssh1_decrypt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsa_ssh1_decrypt_pkcs1");
  if (_Var1) {
    handle_rsa_ssh1_decrypt_pkcs1(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsastr_fmt");
  if (_Var1) {
    handle_rsastr_fmt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsa_ssh1_fingerprint");
  if (_Var1) {
    handle_rsa_ssh1_fingerprint(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"rsa_ssh1_public_blob");
  if (_Var1) {
    handle_rsa_ssh1_public_blob(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsa_ssh1_public_blob_len");
  if (_Var1) {
    handle_rsa_ssh1_public_blob_len(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"rsa_ssh1_private_blob_agent");
  if (_Var1) {
    handle_rsa_ssh1_private_blob_agent(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"prng_new");
  if (_Var1) {
    handle_prng_new(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"prng_seed_begin");
  if (_Var1) {
    ppVar10 = get_val_prng(in);
    prng_seed_begin(ppVar10);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"prng_seed_update");
  if (_Var1) {
    handle_prng_seed_update(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"prng_seed_finish");
  if (_Var1) {
    ppVar10 = get_val_prng(in);
    prng_seed_finish(ppVar10);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"prng_read");
  if (_Var1) {
    handle_prng_read(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"prng_add_entropy");
  if (_Var1) {
    handle_prng_add_entropy(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ppk_encrypted_s");
  if (_Var1) {
    handle_ppk_encrypted_s(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsa1_encrypted_s");
  if (_Var1) {
    handle_rsa1_encrypted_s(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ppk_loadpub_s");
  if (_Var1) {
    handle_ppk_loadpub_s(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsa1_loadpub_s");
  if (_Var1) {
    handle_rsa1_loadpub_s(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ppk_load_s");
  if (_Var1) {
    handle_ppk_load_s(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsa1_load_s");
  if (_Var1) {
    handle_rsa1_load_s(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ppk_save_sb");
  if (_Var1) {
    handle_ppk_save_sb(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsa1_save_sb");
  if (_Var1) {
    handle_rsa1_save_sb(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ssh2_fingerprint_blob");
  if (_Var1) {
    handle_ssh2_fingerprint_blob(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"argon2");
  if (_Var1) {
    handle_argon2(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"argon2_long_hash");
  if (_Var1) {
    handle_argon2_long_hash(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"openssh_bcrypt");
  if (_Var1) {
    handle_openssh_bcrypt(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsa_generate");
  if (_Var1) {
    handle_rsa_generate(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"dsa_generate");
  if (_Var1) {
    handle_dsa_generate(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecdsa_generate");
  if (_Var1) {
    handle_ecdsa_generate(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"eddsa_generate");
  if (_Var1) {
    handle_eddsa_generate(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"rsa1_generate");
  if (_Var1) {
    handle_rsa1_generate(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"primegen_new_context");
  if (_Var1) {
    handle_primegen_new_context(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"primegen_generate");
  if (_Var1) {
    handle_primegen_generate(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"primegen_mpu_certificate");
  if (_Var1) {
    handle_primegen_mpu_certificate(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"pcs_new");
  if (_Var1) {
    handle_pcs_new(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"pcs_new_with_firstbits");
  if (_Var1) {
    handle_pcs_new_with_firstbits(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"pcs_require_residue");
  if (_Var1) {
    handle_pcs_require_residue(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"pcs_require_residue_1");
  if (_Var1) {
    handle_pcs_require_residue_1(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"pcs_require_residue_1_mod_prime");
  if (_Var1) {
    handle_pcs_require_residue_1_mod_prime(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"pcs_avoid_residue_small");
  if (_Var1) {
    handle_pcs_avoid_residue_small(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"pcs_try_sophie_germain");
  if (_Var1) {
    pVVar5 = get_value_pcs(in);
    pcs_try_sophie_germain((pVVar5->field_2).vu_pcs);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"pcs_set_oneshot");
  if (_Var1) {
    pVVar5 = get_value_pcs(in);
    pcs_set_oneshot((pVVar5->field_2).vu_pcs);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"pcs_ready");
  if (_Var1) {
    pVVar5 = get_value_pcs(in);
    pcs_ready((pVVar5->field_2).vu_pcs);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"pcs_inspect");
  if (_Var1) {
    handle_pcs_inspect(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"pcs_generate");
  if (_Var1) {
    handle_pcs_generate(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"pockle_new");
  if (_Var1) {
    v = pockle_new();
    return_val_pockle(out,v);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"pockle_mark");
  if (_Var1) {
    handle_pockle_mark(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"pockle_release");
  if (_Var1) {
    handle_pockle_release(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"pockle_add_small_prime");
  if (_Var1) {
    handle_pockle_add_small_prime(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"pockle_add_prime");
  if (_Var1) {
    handle_pockle_add_prime(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"pockle_mpu");
  if (_Var1) {
    handle_pockle_mpu(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"miller_rabin_new");
  if (_Var1) {
    handle_miller_rabin_new(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"miller_rabin_test");
  if (_Var1) {
    handle_miller_rabin_test(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"ecdsa_public");
  if (_Var1) {
    handle_ecdsa_public(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"eddsa_public");
  if (_Var1) {
    handle_eddsa_public(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"des_encrypt_xdmauth");
  if (_Var1) {
    handle_des_encrypt_xdmauth(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"des_decrypt_xdmauth");
  if (_Var1) {
    handle_des_decrypt_xdmauth(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"des3_encrypt_pubkey");
  if (_Var1) {
    handle_des3_encrypt_pubkey(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"des3_decrypt_pubkey");
  if (_Var1) {
    handle_des3_decrypt_pubkey(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"des3_encrypt_pubkey_ossh");
  if (_Var1) {
    handle_des3_encrypt_pubkey_ossh(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"des3_decrypt_pubkey_ossh");
  if (_Var1) {
    handle_des3_decrypt_pubkey_ossh(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"aes256_encrypt_pubkey");
  if (_Var1) {
    handle_aes256_encrypt_pubkey(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"aes256_decrypt_pubkey");
  if (_Var1) {
    handle_aes256_decrypt_pubkey(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"crc32_rfc1662");
  if (_Var1) {
    handle_crc32_rfc1662(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"crc32_ssh1");
  if (_Var1) {
    handle_crc32_ssh1(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"crc32_update");
  if (_Var1) {
    handle_crc32_update(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"crcda_detect");
  if (_Var1) {
    handle_crcda_detect(in,out);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"get_implementations_commasep");
  if (_Var1) {
    handle_get_implementations_commasep(in,out);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"http_digest_response");
  if (_Var1) {
    handle_http_digest_response(in,psVar12);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"random_queue");
  if (_Var1) {
    handle_random_queue(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"random_queue_len");
  if (_Var1) {
    sVar11 = bufchain_size(&random_data_queue);
    BinarySink_put_fmt(out->binarysink_,"0x%lX\n",sVar11);
    return;
  }
  psVar12 = psVar6;
  _Var1 = ptrlen_eq_string(pVar13,"random_make_prng");
  if (_Var1) {
    handle_random_make_prng(in,psVar12);
    return;
  }
  _Var1 = ptrlen_eq_string(pVar13,"random_clear");
  if (_Var1) {
    random_clear();
    return;
  }
  uVar4 = string_length_for_printf((size_t)psVar6);
  fatal_error("command \'%.*s\': unrecognised",(ulong)uVar4,pVar13.ptr);
}

Assistant:

static void process_line(BinarySource *in, strbuf *out)
{
    ptrlen id = get_word(in);

#define DISPATCH_INTERNAL(cmdname, handler) do {        \
        if (ptrlen_eq_string(id, cmdname)) {            \
            handler(in, out);                           \
            return;                                     \
        }                                               \
    } while (0)

#define DISPATCH_COMMAND(cmd) DISPATCH_INTERNAL(#cmd, handle_##cmd)
    DISPATCH_COMMAND(hello);
    DISPATCH_COMMAND(free);
    DISPATCH_COMMAND(newstring);
    DISPATCH_COMMAND(getstring);
    DISPATCH_COMMAND(mp_literal);
    DISPATCH_COMMAND(mp_dump);
    DISPATCH_COMMAND(checkenum);
#undef DISPATCH_COMMAND

#define FUNC_INNER(outtype, fname, realname, ...)       \
    DISPATCH_INTERNAL(#fname,handle_##fname);
#define ARG1(type, arg)
#define ARGN(type, arg)
#define VOID
#include "testcrypt-func.h"
#undef FUNC_INNER
#undef ARG
#undef VOID

#undef DISPATCH_INTERNAL

    fatal_error("command '%.*s': unrecognised", PTRLEN_PRINTF(id));
}